

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward8.c
# Opt level: O0

void intogroup(group_conflict g,list_conflict head,list_conflict tail,boolean finis)

{
  group pgVar1;
  group_conflict newg;
  boolean finis_local;
  list_conflict tail_local;
  list_conflict head_local;
  group_conflict g_local;
  
  if (g->head == (list_conflict)0x0) {
    g->head = head;
    g->tail = tail;
    g->finis = finis;
    g->insp = g;
  }
  else if ((finis == 0) || (g->insp->finis == 0)) {
    pgVar1 = (group)allocmem(groupmem,0x30);
    pgVar1->head = head;
    pgVar1->tail = tail;
    pgVar1->next = g->insp->next;
    pgVar1->nextunf = g->insp->nextunf;
    pgVar1->finis = finis;
    g->insp->next = pgVar1;
    g->insp->nextunf = pgVar1;
    g->insp = pgVar1;
  }
  else {
    g->insp->tail->next = head;
    g->insp->tail = tail;
  }
  return;
}

Assistant:

static void intogroup(group g, list head, list tail, boolean finis)
{
   group newg;

   if (!g->head) {   /* back into old group */
      g->head = head;
      g->tail = tail;
      g->finis = finis;
      g->insp = g;
   } else if (finis && g->insp->finis) {  /* don't split if both */
      g->insp->tail->next = head;         /* groups are finished */
      g->insp->tail = tail;
   }
   else {   /* split */
      newg = (group) allocmem(groupmem, sizeof(struct grouprec));
      newg->head = head;
      newg->tail = tail;
      newg->next = g->insp->next;
      newg->nextunf = g->insp->nextunf;
      newg->finis = finis;
      g->insp = g->insp->nextunf = g->insp->next = newg;
   }
}